

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_io_primitive_printLine
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  size_t __size;
  ulong uVar4;
  bool bVar5;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar4 = *arguments;
  if ((uVar4 & 0xf) == 0 && uVar4 != 0) {
    uVar4 = (ulong)(*(uint *)(uVar4 + 0xc) >> 3);
  }
  else {
    uVar4 = 0;
  }
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      uVar1 = *arguments;
      if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
        sVar2 = *(sysbvm_tuple_t *)(uVar1 + 0x10 + uVar3 * 8);
      }
      else {
        sVar2 = 0;
      }
      sVar2 = sysbvm_tuple_asString(context,sVar2);
      bVar5 = (sVar2 & 0xf) != 0;
      if ((bVar5 || sVar2 == 0) || ((*(uint *)(sVar2 + 8) & 0x300) != 0x200)) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/io.c:107: assertion failure: sysbvm_tuple_isBytes(string)"
                  );
      }
      if (bVar5 || sVar2 == 0) {
        __size = 0;
      }
      else {
        __size = (size_t)*(uint *)(sVar2 + 0xc);
      }
      fwrite((void *)(sVar2 + 0x10),__size,1,_stdout);
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  fputc(10,_stdout);
  return 0x2f;
}

Assistant:

static sysbvm_tuple_t sysbvm_io_primitive_printLine(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    size_t parameterCount = sysbvm_array_getSize(arguments[0]);
    for(size_t i = 0; i < parameterCount; ++i)
    {
        sysbvm_tuple_t string = sysbvm_tuple_asString(context, sysbvm_array_at(arguments[0], i));
        SYSBVM_ASSERT(sysbvm_tuple_isBytes(string));
        fwrite(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(string)->bytes, sysbvm_tuple_getSizeInBytes(string), 1, stdout);

    }
    fwrite("\n", 1, 1, stdout);

    return SYSBVM_VOID_TUPLE;
}